

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O0

QPDFOutlineObjectHelper *
QPDFOutlineObjectHelper::Accessor::create
          (QPDFOutlineObjectHelper *__return_storage_ptr__,QPDFObjectHandle *oh,
          QPDFOutlineDocumentHelper *dh,int depth)

{
  QPDFObjectHandle local_38;
  int local_24;
  QPDFOutlineDocumentHelper *pQStack_20;
  int depth_local;
  QPDFOutlineDocumentHelper *dh_local;
  QPDFObjectHandle *oh_local;
  
  local_24 = depth;
  pQStack_20 = dh;
  dh_local = (QPDFOutlineDocumentHelper *)oh;
  oh_local = (QPDFObjectHandle *)__return_storage_ptr__;
  QPDFObjectHandle::QPDFObjectHandle(&local_38,oh);
  QPDFOutlineObjectHelper(__return_storage_ptr__,&local_38,pQStack_20,local_24);
  QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static QPDFOutlineObjectHelper
        create(QPDFObjectHandle oh, QPDFOutlineDocumentHelper& dh, int depth)
        {
            return {oh, dh, depth};
        }